

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O3

void __thiscall duckdb::CTableFunctionInfo::~CTableFunctionInfo(CTableFunctionInfo *this)

{
  ~CTableFunctionInfo(this);
  operator_delete(this);
  return;
}

Assistant:

~CTableFunctionInfo() override {
		if (extra_info && delete_callback) {
			delete_callback(extra_info);
		}
		extra_info = nullptr;
		delete_callback = nullptr;
	}